

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

int32_t __thiscall
fasttext::Dictionary::getStringNoNewline
          (Dictionary *this,string_view in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  entry_type eVar2;
  bool bVar3;
  uint32_t h;
  int32_t id;
  size_type sVar4;
  Dictionary *this_00;
  int32_t iVar5;
  basic_string_view<char,_std::char_traits<char>_> str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  uint32_t local_7c;
  string_view in_local;
  vector<int,_std::allocator<int>_> word_hashes;
  
  in_local._M_str = in._M_str;
  in_local._M_len = in._M_len;
  word_hashes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  word_hashes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  word_hashes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  iVar5 = 0;
  do {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&in_local," \n\r\t\v\f",0
                       ,6);
    if (sVar4 == 0xffffffffffffffff) {
      in_local._M_str = in_local._M_str + in_local._M_len;
      in_local._M_len = 0;
      break;
    }
    in_local._M_str = in_local._M_str + sVar4;
    in_local._M_len = in_local._M_len - sVar4;
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      ((basic_string_view<char,_std::char_traits<char>_> *)&in_local," \n\r\t\v\f",0
                       ,6);
    this_00 = (Dictionary *)&in_local;
    str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&in_local,0,sVar4);
    in_local._M_str = in_local._M_str + str._M_len;
    in_local._M_len = in_local._M_len - str._M_len;
    h = hash(this_00,str);
    id = getId(this,str,h);
    if (id < 0) {
      eVar2 = getType(this,str);
    }
    else {
      eVar2 = getType(this,id);
    }
    if (eVar2 == word) {
      addSubwords(this,words,str,id);
      local_7c = h;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&word_hashes,(int *)&local_7c);
    }
    else if (-1 < id && eVar2 == label) {
      local_7c = id - this->nwords_;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(labels,(int *)&local_7c);
    }
    __y._M_str = EOS_abi_cxx11_;
    __y._M_len = DAT_00158478;
    bVar3 = std::operator==(str,__y);
    iVar5 = iVar5 + 1;
  } while (!bVar3);
  addWordNgrams(this,words,&word_hashes,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&word_hashes.super__Vector_base<int,_std::allocator<int>_>);
  return iVar5;
}

Assistant:

int32_t Dictionary::getStringNoNewline(
    std::string_view in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string_view token;
  int32_t ntokens = 0;

  words.clear();
  labels.clear();
  while (readWordNoNewline(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}